

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2mem.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *__filename;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  long *plVar7;
  FILE *pFVar8;
  FILE *__s;
  size_t sVar9;
  FILE *pFVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  char *__s_00;
  char *pcVar14;
  int iVar15;
  int EOP;
  int top_count;
  int bottom_count;
  int blob_index;
  int layer_count;
  int blob_count;
  int v;
  int typeindex;
  int magic;
  string parambinpath;
  int id;
  string include_guard_var;
  string param_var;
  char layer_type [33];
  char layer_name [257];
  char bottom_name [257];
  int local_348;
  int local_344;
  int local_340;
  uint local_33c;
  int local_338;
  int local_334;
  long local_330;
  FILE *local_328;
  undefined1 local_31c [4];
  int local_318 [2];
  char *local_310;
  FILE *local_308;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  long *local_2e0 [2];
  long local_2d0 [2];
  char *local_2c0;
  string local_2b8;
  string local_298;
  string local_278;
  string local_248 [8];
  string local_138 [8];
  
  if (argc != 5) {
    main_cold_1();
    return -1;
  }
  pcVar14 = argv[1];
  pcVar1 = argv[2];
  __filename = argv[3];
  local_310 = argv[4];
  pcVar6 = strrchr(pcVar14,0x2f);
  __s_00 = pcVar6 + 1;
  if (pcVar6 == (char *)0x0) {
    __s_00 = pcVar14;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_248,__s_00,(allocator<char> *)local_138);
  plVar7 = (long *)std::__cxx11::string::append((char *)local_248);
  local_300 = &local_2f0;
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_2f0 = *plVar11;
    lStack_2e8 = plVar7[3];
  }
  else {
    local_2f0 = *plVar11;
    local_300 = (long *)*plVar7;
  }
  local_2f8 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_2c0 = pcVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
    operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
  }
  plVar7 = local_300;
  pFVar8 = fopen(pcVar14,"rb");
  if (pFVar8 == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",pcVar14);
    goto LAB_00112167;
  }
  __s = fopen((char *)plVar7,"wb");
  local_328 = fopen(__filename,"wb");
  path_to_varname_abi_cxx11_(&local_298,pcVar14);
  path_to_varname_abi_cxx11_(&local_2b8,__filename);
  pFVar10 = local_328;
  fprintf(local_328,"#ifndef NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
  fprintf(pFVar10,"#define NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
  fprintf(pFVar10,"namespace %s_id {\n",local_298._M_dataplus._M_p);
  local_318[1] = 0;
  uVar3 = __isoc99_fscanf(pFVar8,"%d");
  if (uVar3 == 1) {
    fwrite(local_318 + 1,4,1,__s);
    local_338 = 0;
    local_334 = 0;
    uVar3 = __isoc99_fscanf(pFVar8,"%d %d");
    if (uVar3 != 2) {
      pcVar14 = "read layer_count and blob_count failed %d\n";
      goto LAB_0011211c;
    }
    fwrite(&local_338,4,1,__s);
    fwrite(&local_334,4,1,__s);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&layer_names_abi_cxx11_,(long)local_338);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&blob_names_abi_cxx11_,(long)local_334);
    local_33c = 0;
    if (0 < local_338) {
      local_330 = 0;
      local_308 = __s;
      do {
        local_340 = 0;
        local_344 = 0;
        uVar3 = __isoc99_fscanf(pFVar8,"%32s %256s %d %d",&local_278,local_248,&local_340,&local_344
                               );
        if (uVar3 != 4) {
          pcVar14 = "read layer params failed %d\n";
          goto LAB_0011211c;
        }
        sanitize_name((char *)local_248);
        local_318[0] = ncnn::layer_to_index((char *)&local_278);
        fwrite(local_318,4,1,__s);
        fwrite(&local_340,4,1,__s);
        fwrite(&local_344,4,1,__s);
        fprintf(local_328,"const int LAYER_%s = %d;\n",local_248,local_330);
        if (0 < local_340) {
          iVar15 = 0;
          do {
            uVar3 = __isoc99_fscanf(pFVar8,"%256s",local_138);
            if (uVar3 != 1) {
              pcVar14 = "read bottom_name failed %d\n";
              goto LAB_0011211c;
            }
            sanitize_name((char *)local_138);
            if (blob_names_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                blob_names_abi_cxx11_.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              lVar12 = 0;
              uVar13 = 0;
              do {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)((long)&((blob_names_abi_cxx11_.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar12));
                if (iVar4 == 0) goto LAB_00111d90;
                uVar13 = uVar13 + 1;
                lVar12 = lVar12 + 0x20;
              } while (uVar13 < (ulong)((long)blob_names_abi_cxx11_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)blob_names_abi_cxx11_.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            fprintf(_stderr,"find_blob_index_by_name %s failed\n",local_138);
            uVar13 = 0xffffffff;
LAB_00111d90:
            local_2e0[0] = (long *)CONCAT44(local_2e0[0]._4_4_,(int)uVar13);
            fwrite(local_2e0,4,1,local_308);
            iVar15 = iVar15 + 1;
          } while (iVar15 < local_340);
        }
        __s = local_308;
        if (0 < local_344) {
          iVar15 = 0;
          do {
            uVar3 = __isoc99_fscanf(pFVar8,"%256s",local_138);
            if (uVar3 != 1) {
              pcVar14 = "read blob_name failed %d\n";
              goto LAB_0011211c;
            }
            sanitize_name((char *)local_138);
            local_2e0[0] = local_2d0;
            sVar9 = strlen((char *)local_138);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2e0,local_138,(long)&local_138[0]._M_dataplus._M_p + sVar9);
            uVar3 = local_33c;
            std::__cxx11::string::operator=
                      ((string *)
                       (blob_names_abi_cxx11_.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (int)local_33c),
                       (string *)local_2e0);
            if (local_2e0[0] != local_2d0) {
              operator_delete(local_2e0[0],local_2d0[0] + 1);
            }
            fprintf(local_328,"const int BLOB_%s = %d;\n",local_138,(ulong)uVar3);
            fwrite(&local_33c,4,1,__s);
            local_33c = local_33c + 1;
            iVar15 = iVar15 + 1;
          } while (iVar15 < local_344);
        }
        local_2e0[0] = (long *)((ulong)local_2e0[0] & 0xffffffff00000000);
        while (iVar15 = __isoc99_fscanf(pFVar8,"%d=",local_2e0), iVar15 == 1) {
          fwrite(local_2e0,4,1,__s);
          if ((int)local_2e0[0] < -0x5b03) {
            local_348 = 0;
            uVar3 = __isoc99_fscanf(pFVar8,"%d",&local_348);
            if (uVar3 != 1) {
              pcVar14 = "read array length failed %d\n";
              goto LAB_0011211c;
            }
            fwrite(&local_348,4,1,__s);
            if (0 < local_348) {
              iVar15 = 0;
              do {
                uVar3 = __isoc99_fscanf(pFVar8,",%15[^,\n ]",local_138);
                if (uVar3 != 1) {
                  pcVar14 = "read array element failed %d\n";
                  goto LAB_0011211c;
                }
                bVar2 = vstr_is_float((char *)local_138);
                if (bVar2) {
                  pcVar14 = "%f";
                }
                else {
                  pcVar14 = "%d";
                }
                __isoc99_sscanf(local_138,pcVar14,local_31c);
                fwrite(local_31c,4,1,__s);
                iVar15 = iVar15 + 1;
              } while (iVar15 < local_348);
            }
          }
          else {
            uVar3 = __isoc99_fscanf(pFVar8,"%15s",local_138);
            if (uVar3 != 1) {
              pcVar14 = "read value failed %d\n";
              goto LAB_0011211c;
            }
            bVar2 = vstr_is_float((char *)local_138);
            if (bVar2) {
              pcVar14 = "%f";
            }
            else {
              pcVar14 = "%d";
            }
            __isoc99_sscanf(local_138,pcVar14,&local_348);
            fwrite(&local_348,4,1,__s);
          }
        }
        local_348 = -0xe9;
        fwrite(&local_348,4,1,__s);
        local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
        sVar9 = strlen((char *)local_248);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,local_248,(long)&local_248[0]._M_dataplus._M_p + sVar9);
        std::__cxx11::string::operator=
                  ((string *)
                   (layer_names_abi_cxx11_.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + local_330),(string *)local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
          operator_delete(local_138[0]._M_dataplus._M_p,
                          local_138[0].field_2._M_allocated_capacity + 1);
        }
        local_330 = local_330 + 1;
      } while (local_330 < local_338);
    }
    pFVar10 = local_328;
    fprintf(local_328,"} // namespace %s_id\n",local_298._M_dataplus._M_p);
    fprintf(pFVar10,"#endif // NCNN_INCLUDE_GUARD_%s\n",local_2b8._M_dataplus._M_p);
    fclose(pFVar8);
    fclose(__s);
    fclose(pFVar10);
  }
  else {
    pcVar14 = "read magic failed %d\n";
LAB_0011211c:
    fprintf(_stderr,pcVar14,(ulong)uVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
LAB_00112167:
  plVar7 = local_300;
  pFVar8 = fopen(local_310,"wb");
  path_to_varname_abi_cxx11_(local_248,(char *)plVar7);
  path_to_varname_abi_cxx11_(local_138,local_310);
  pFVar10 = fopen((char *)plVar7,"rb");
  if (pFVar10 == (FILE *)0x0) {
    fprintf(_stderr,"fopen %s failed\n",plVar7);
  }
  else {
    fprintf(pFVar8,"#ifndef NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
    fprintf(pFVar8,"#define NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
    fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n",
           0x4f,1,pFVar8);
    fprintf(pFVar8,"static const unsigned char %s[] = {\n",local_248[0]._M_dataplus._M_p);
    iVar15 = feof(pFVar10);
    if (iVar15 == 0) {
      uVar3 = 1;
      do {
        uVar5 = fgetc(pFVar10);
        if (uVar5 == 0xffffffff) break;
        fprintf(pFVar8,"0x%02x,",(ulong)uVar5);
        if ((uVar3 & 0xf) == 0) {
          fputc(10,pFVar8);
        }
        iVar15 = feof(pFVar10);
        uVar3 = uVar3 + 1;
      } while (iVar15 == 0);
    }
    fwrite("};\n",3,1,pFVar8);
    fclose(pFVar10);
    pcVar14 = local_2c0;
    path_to_varname_abi_cxx11_(&local_278,local_2c0);
    pFVar10 = fopen(pcVar14,"rb");
    if (pFVar10 == (FILE *)0x0) {
      fprintf(_stderr,"fopen %s failed\n",pcVar14);
    }
    else {
      fwrite("\n#ifdef _MSC_VER\n__declspec(align(4))\n#else\n__attribute__((aligned(4)))\n#endif\n"
             ,0x4f,1,pFVar8);
      fprintf(pFVar8,"static const unsigned char %s[] = {\n",local_278._M_dataplus._M_p);
      iVar15 = feof(pFVar10);
      if (iVar15 == 0) {
        uVar3 = 1;
        do {
          uVar5 = fgetc(pFVar10);
          if (uVar5 == 0xffffffff) break;
          fprintf(pFVar8,"0x%02x,",(ulong)uVar5);
          if ((uVar3 & 0xf) == 0) {
            fputc(10,pFVar8);
          }
          iVar15 = feof(pFVar10);
          uVar3 = uVar3 + 1;
        } while (iVar15 == 0);
      }
      fwrite("};\n",3,1,pFVar8);
      fprintf(pFVar8,"#endif // NCNN_INCLUDE_GUARD_%s\n",local_138[0]._M_dataplus._M_p);
      fclose(pFVar10);
      fclose(pFVar8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248[0]._M_dataplus._M_p != &local_248[0].field_2) {
    operator_delete(local_248[0]._M_dataplus._M_p,local_248[0].field_2._M_allocated_capacity + 1);
  }
  if (local_300 != &local_2f0) {
    operator_delete(local_300,local_2f0 + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 5)
    {
        fprintf(stderr, "Usage: %s [ncnnproto] [ncnnbin] [idcpppath] [memcpppath]\n", argv[0]);
        return -1;
    }

    const char* parampath = argv[1];
    const char* modelpath = argv[2];
    const char* idcpppath = argv[3];
    const char* memcpppath = argv[4];

    const char* lastslash = strrchr(parampath, '/');
    const char* name = lastslash == NULL ? parampath : lastslash + 1;

    std::string parambinpath = std::string(name) + ".bin";

    dump_param(parampath, parambinpath.c_str(), idcpppath);

    write_memcpp(parambinpath.c_str(), modelpath, memcpppath);

    return 0;
}